

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mathtypes.cpp
# Opt level: O0

void tst_vec2(void)

{
  ostream *poVar1;
  vec2 vVar2;
  float local_20;
  float fStack_1c;
  vec2 r;
  vec2 b;
  vec2 a;
  
  rengine::vec2::vec2(&b,1.0,2.0);
  rengine::vec2::vec2(&r,3.0,4.0);
  vVar2 = rengine::vec2::operator+(&b,r);
  local_20 = vVar2.x;
  if ((local_20 != 4.0) || (NAN(local_20))) {
    __assert_fail("r.x == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_mathtypes.cpp"
                  ,0x27,"void tst_vec2()");
  }
  fStack_1c = vVar2.y;
  if ((fStack_1c == 6.0) && (!NAN(fStack_1c))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"void tst_vec2()");
    poVar1 = std::operator<<(poVar1,": ok");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("r.y == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_mathtypes.cpp"
                ,0x28,"void tst_vec2()");
}

Assistant:

void tst_vec2()
{
    vec2 a(1, 2);
    vec2 b(3, 4);

    vec2 r = a + b;
    assert(r.x == 4);
    assert(r.y == 6);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}